

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_dpi_function_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,bool int_interface)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
  *pmVar3;
  pointer *end;
  element_type *peVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  undefined1 this_00 [8];
  pointer pbVar5;
  undefined8 uVar6;
  uint uVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  long lVar14;
  Port *port;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  string *sep;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_analysis_cc:1222:57)>
  __comp;
  undefined1 auVar15 [8];
  long *plVar16;
  bool bVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  stringstream local_380 [8];
  stringstream stream;
  DPIVisitor visitor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  undefined1 local_140 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_str;
  undefined1 auStack_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  string dpi_type;
  size_type *local_90;
  string type_str;
  long local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50 [2];
  long local_40 [2];
  
  dpi_type.field_2._12_4_ = SUB84(top,0);
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  stream._384_8_ = &PTR_visit_root_002bad08;
  pmVar3 = &visitor.dpi_funcs_;
  visitor.dpi_funcs_._M_t._M_impl._0_4_ = 0;
  visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar3;
  visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar3;
  IRVisitor::visit_root((IRVisitor *)&stream.field_0x180,(IRNode *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)pmVar3
     ) {
    p_Var12 = visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      std::__cxx11::stringstream::stringstream(local_380);
      port_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&dpi_type._M_string_length;
      dpi_type._M_dataplus._M_p = (pointer)0x0;
      dpi_type._M_string_length._0_1_ = 0;
      sep = (string *)0x5;
      pcVar13 = " pure";
      if (*(char *)(*(long *)(p_Var12 + 2) + 0x185) == '\0') {
        sep = (string *)0x8;
        pcVar13 = " context";
        if (*(char *)(*(long *)(p_Var12 + 2) + 0x184) == '\x01') goto LAB_00219009;
      }
      else {
LAB_00219009:
        std::__cxx11::string::_M_replace
                  ((ulong)&port_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0,(char *)0x0,
                   (ulong)pcVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stream.field_0x8,"import \"DPI-C\"",0xe);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&stream.field_0x8,
                          (char *)port_names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)dpi_type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," function ",10);
      uVar7 = *(uint *)(*(long *)(p_Var12 + 2) + 0x180);
      lVar14 = 5;
      if (uVar7 == 0) {
        pcVar13 = "void ";
      }
      else if (uVar7 == 1) {
        lVar14 = 4;
        pcVar13 = "bit ";
      }
      else {
        pcVar13 = "byte ";
        if (8 < uVar7) {
          lVar14 = 9;
          pcVar13 = "shortint ";
          if (0x10 < uVar7) {
            pcVar13 = "longint ";
            if (0x20 >= uVar7) {
              pcVar13 = "int ";
            }
            lVar14 = (ulong)(0x20 < uVar7) * 4 + 4;
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stream.field_0x8,pcVar13,lVar14);
      type_str.field_2._8_8_ = &local_60;
      lVar14 = *(long *)(*(long *)(p_Var12 + 2) + 0xe8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&type_str.field_2 + 8),lVar14,
                 *(long *)(*(long *)(p_Var12 + 2) + 0xf0) + lVar14);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&stream.field_0x8,(char *)type_str.field_2._8_8_,local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_str.field_2._8_8_ != &local_60) {
        operator_delete((void *)type_str.field_2._8_8_,local_60._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  *)&visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  *)(*(long *)(p_Var12 + 2) + 0x108));
      auStack_f8 = (undefined1  [8])0x0;
      port_str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      port_str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_f8,(size_type)ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               );
      auStack_d8 = (undefined1  [8])0x0;
      port_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      port_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_d8,(size_type)ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               );
      p_Var9 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      __first._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8;
      __last._M_current =
           port_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      while (auStack_d8 = (undefined1  [8])__first._M_current,
            port_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = __last._M_current,
            p_Var9 != (_Rb_tree_node_base *)&ports) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                  );
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        __first._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8;
        __last._M_current =
             port_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      local_118.field_2._8_8_ = p_Var12;
      if (__first._M_current != __last._M_current) {
        __comp._M_comp.ordering = (anon_class_8_1_317e4b52)(*(long *)(p_Var12 + 2) + 0x150);
        uVar10 = (long)__last._M_current - (long)__first._M_current >> 5;
        lVar14 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::extract_dpi_function(kratos::Generator*,bool)::__0>>
                  (__first,__last,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_analysis_cc:1222:57)>
                    )__comp._M_comp.ordering);
        if ((long)__last._M_current - (long)__first._M_current < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::extract_dpi_function(kratos::Generator*,bool)::__0>>
                    (__first,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_analysis_cc:1222:57)>
                      )__comp._M_comp.ordering);
        }
        else {
          __last_00._M_current = __first._M_current + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::extract_dpi_function(kratos::Generator*,bool)::__0>>
                    (__first,__last_00,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_analysis_cc:1222:57)>
                      )__comp._M_comp.ordering);
          for (; __last_00._M_current != __last._M_current;
              __last_00._M_current = __last_00._M_current + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::extract_dpi_function(kratos::Generator*,bool)::__0>>
                      (__last_00,__comp);
          }
        }
      }
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)port_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      auVar15 = auStack_d8;
      if (auStack_d8 !=
          (undefined1  [8])
          port_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          if (dpi_type.field_2._M_local_buf[0xc] == '\0') {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                      ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                            *)&visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type *)auVar15);
            psVar2 = (string *)((long)&type_str.field_2 + 8);
            SystemVerilogCodeGen::get_port_str_abi_cxx11_
                      (psVar2,(SystemVerilogCodeGen *)
                              (pmVar11->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,port);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       auStack_f8,psVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)type_str.field_2._8_8_ != &local_60) {
              operator_delete((void *)type_str.field_2._8_8_,local_60._M_allocated_capacity + 1);
            }
          }
          else {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                      ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                            *)&visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type *)auVar15);
            peVar4 = (pmVar11->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_118.field_2._M_allocated_capacity =
                 (size_type)
                 (pmVar11->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_118.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_118.field_2._M_allocated_capacity)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_118.field_2._M_allocated_capacity)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_118.field_2._M_allocated_capacity)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_118.field_2._M_allocated_capacity)->_M_use_count + 1;
              }
            }
            local_90 = &type_str._M_string_length;
            type_str._M_dataplus._M_p = (pointer)0x0;
            type_str._M_string_length._0_1_ = 0;
            uVar7 = (*(peVar4->super_Var).super_IRNode._vptr_IRNode[7])(peVar4);
            if (uVar7 < 9) {
              sep = (string *)0x4;
              pcVar13 = "byte";
            }
            else {
              uVar7 = (*(peVar4->super_Var).super_IRNode._vptr_IRNode[7])(peVar4);
              if (uVar7 < 0x11) {
                sep = (string *)0x8;
                pcVar13 = "shortint";
              }
              else {
                uVar7 = (*(peVar4->super_Var).super_IRNode._vptr_IRNode[7])(peVar4);
                pcVar13 = "longint";
                if (0x20 >= uVar7) {
                  pcVar13 = "int";
                }
                sep = (string *)((ulong)(0x20 < uVar7) * 4 + 3);
              }
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_90,0,type_str._M_dataplus._M_p,(ulong)pcVar13);
            bVar17 = peVar4->direction_ == In;
            pcVar13 = "output";
            if (bVar17) {
              pcVar13 = "input";
            }
            type_str.field_2._8_8_ = &local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&type_str.field_2 + 8),pcVar13,pcVar13 + (6 - (ulong)bVar17)
                      );
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,local_90,type_str._M_dataplus._M_p + (long)local_90);
            __l._M_len = 2;
            __l._M_array = (iterator)((long)&type_str.field_2 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_140,__l,
                     (allocator_type *)
                     &strs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            lVar14 = -0x40;
            plVar16 = local_40;
            do {
              if (plVar16 != (long *)plVar16[-2]) {
                operator_delete((long *)plVar16[-2],*plVar16 + 1);
              }
              plVar16 = plVar16 + -4;
              lVar14 = lVar14 + 0x20;
            } while (lVar14 != 0);
            if ((peVar4->super_Var).is_signed_ == true) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[7]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_140,(char (*) [7])0x2460bd);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar15)
            ;
            pbVar5 = strs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            this_00 = local_140;
            strs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_118;
            end = &strs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>((string *)end," ","");
            psVar2 = (string *)((long)&type_str.field_2 + 8);
            string::
            join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (psVar2,(string *)this_00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pbVar5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )end,sep);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       auStack_f8,psVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)type_str.field_2._8_8_ != &local_60) {
              operator_delete((void *)type_str.field_2._8_8_,local_60._M_allocated_capacity + 1);
            }
            if (strs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_118) {
              operator_delete(strs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (ulong)(local_118._M_dataplus._M_p + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_140);
            if (local_90 != &type_str._M_string_length) {
              operator_delete(local_90,CONCAT71(type_str._M_string_length._1_7_,
                                                (undefined1)type_str._M_string_length) + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_118.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_118.field_2._M_allocated_capacity);
            }
          }
          auVar15 = (undefined1  [8])((long)auVar15 + 0x20);
        } while (auVar15 != (undefined1  [8])ports._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
      }
      pbVar5 = port_str.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar15 = auStack_f8;
      local_90 = &type_str._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
      string::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((string *)((long)&type_str.field_2 + 8),(string *)auVar15,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_90,sep);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stream.field_0x8,(char *)type_str.field_2._8_8_,local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_str.field_2._8_8_ != &local_60) {
        operator_delete((void *)type_str.field_2._8_8_,local_60._M_allocated_capacity + 1);
      }
      if (local_90 != &type_str._M_string_length) {
        operator_delete(local_90,CONCAT71(type_str._M_string_length._1_7_,
                                          (undefined1)type_str._M_string_length) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&stream.field_0x8,");",2);
      std::__cxx11::stringbuf::str();
      uVar6 = local_118.field_2._8_8_;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_118.field_2._8_8_ + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type_str.field_2 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_str.field_2._8_8_ != &local_60) {
        operator_delete((void *)type_str.field_2._8_8_,local_60._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   *)&visitor.dpi_funcs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (port_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&dpi_type._M_string_length)
      {
        operator_delete(port_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(dpi_type._M_string_length._1_7_,
                                 (undefined1)dpi_type._M_string_length) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_380);
      std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar6);
    } while (p_Var12 != (_Base_ptr)&visitor.dpi_funcs_);
  }
  stream._384_8_ = &PTR_visit_root_002bad08;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
               *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  stream._384_8_ = &PTR_visit_root_002b4da0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> extract_dpi_function(Generator* top, bool int_interface) {
    DPIVisitor visitor;
    visitor.visit_root(top);
    // code gen these dpi info
    std::map<std::string, std::string> result;
    auto const& dpi_funcs = visitor.dpi_funcs();
    for (auto const& [func_name, stmt] : dpi_funcs) {
        std::stringstream stream;
        // dpi-c
        std::string dpi_type;
        if (stmt->is_pure())
            dpi_type = " pure";
        else if (stmt->is_context())
            dpi_type = " context";
        stream << "import \"DPI-C\"" << dpi_type << " function ";
        // based on the return width, we choose the closest one
        if (stmt->return_width() == 0) {
            stream << "void ";
        } else if (stmt->return_width() == 1) {
            stream << "bit ";
        } else if (stmt->return_width() <= 8) {
            stream << "byte ";
        } else if (stmt->return_width() <= 16) {
            stream << "shortint ";
        } else if (stmt->return_width() <= 32) {
            stream << "int ";
        } else {
            stream << "longint ";
        }
        stream << stmt->function_name() << "(";
        auto ports = stmt->ports();
        std::vector<std::string> port_str;
        port_str.reserve(ports.size());
        std::vector<std::string> port_names;
        port_names.reserve(ports.size());
        for (auto const& iter : ports) port_names.emplace_back(iter.first);

        // sort based on ordering
        auto const& ordering = stmt->port_ordering();
        std::sort(port_names.begin(), port_names.end(), [&](const auto& lhs, const auto& rhs) {
            return ordering.at(lhs) < ordering.at(rhs);
        });

        for (auto const& port_name : port_names) {
            if (int_interface) {
                auto port = ports.at(port_name);
                // compute the closest width
                std::string type_str;
                if (port->width() <= 8) {
                    type_str = "byte";
                } else if (port->width() <= 16) {
                    type_str = "shortint";
                } else if (port->width() <= 32) {
                    type_str = "int";
                } else {
                    type_str = "longint";
                }
                std::vector<std::string> strs{
                    port->port_direction() == PortDirection::In ? "input" : "output", type_str};
                if (port->is_signed()) strs.emplace_back("signed");
                strs.emplace_back(port_name);
                port_str.emplace_back(string::join(strs.begin(), strs.end(), " "));
            } else {
                port_str.emplace_back(
                    SystemVerilogCodeGen::get_port_str(ports.at(port_name).get()));
            }
        }
        stream << string::join(port_str.begin(), port_str.end(), ", ");
        stream << ");";

        result.emplace(func_name, stream.str());
    }
    return result;
}